

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::size(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
  *pFVar3;
  int iVar4;
  int iVar5;
  
  pFVar2 = (this->left_->fadexpr_).left_;
  pFVar3 = (this->left_->fadexpr_).right_;
  iVar1 = (((pFVar2->fadexpr_).left_)->dx_).num_elts;
  iVar4 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if (iVar4 < iVar1) {
    iVar4 = iVar1;
  }
  iVar1 = (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar5 = (((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  if (iVar5 < iVar4) {
    iVar5 = iVar4;
  }
  iVar1 = (((((this->right_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar4 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar4 < iVar1) {
    iVar4 = iVar1;
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  return iVar4;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }